

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_byte_orderings(test_state *state)

{
  int status;
  test_state *state_local;
  
  printf("-----------------------------------\n");
  printf("Checking no PP, LSB first, unsigned\n");
  printf("-----------------------------------\n");
  state_local._4_4_ = check_bps(state);
  if (state_local._4_4_ == 0) {
    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    state->strm->flags = state->strm->flags | 8;
    state_local._4_4_ = check_bps(state);
    if (state_local._4_4_ == 0) {
      printf("-----------------------------------\n");
      printf("Checking PP, LSB first, signed\n");
      printf("-----------------------------------\n");
      state->strm->flags = state->strm->flags | 1;
      state_local._4_4_ = check_bps(state);
      if (state_local._4_4_ == 0) {
        state->strm->flags = state->strm->flags & 0xfffffffe;
        state->strm->flags = state->strm->flags | 4;
        printf("-----------------------------------\n");
        printf("Checking PP, MSB first, unsigned\n");
        printf("-----------------------------------\n");
        state_local._4_4_ = check_bps(state);
        if (state_local._4_4_ == 0) {
          printf("-----------------------------------\n");
          printf("Checking PP, MSB first, signed\n");
          printf("-----------------------------------\n");
          state->strm->flags = state->strm->flags | 1;
          state_local._4_4_ = check_bps(state);
          if (state_local._4_4_ == 0) {
            state_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return state_local._4_4_;
}

Assistant:

int check_byte_orderings(struct test_state *state)
{
    int status;

    printf("-----------------------------------\n");
    printf("Checking no PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, unsigned\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_PREPROCESS;
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, LSB first, signed\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_SIGNED;

    status = check_bps(state);
    if (status)
        return status;

    state->strm->flags &= ~AEC_DATA_SIGNED;
    state->strm->flags |= AEC_DATA_MSB;

    printf("-----------------------------------\n");
    printf("Checking PP, MSB first, unsigned\n");
    printf("-----------------------------------\n");
    status = check_bps(state);
    if (status)
        return status;

    printf("-----------------------------------\n");
    printf("Checking PP, MSB first, signed\n");
    printf("-----------------------------------\n");
    state->strm->flags |= AEC_DATA_SIGNED;

    status = check_bps(state);
    if (status)
        return status;
    return 0;
}